

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

void * ShGetExecutable(ShHandle handle)

{
  long *plVar1;
  TLinker *linker;
  TShHandleBase *base;
  ShHandle handle_local;
  
  if (handle == (ShHandle)0x0) {
    handle_local = (ShHandle)0x0;
  }
  else {
    plVar1 = (long *)(**(code **)(*handle + 0x18))();
    if (plVar1 == (long *)0x0) {
      handle_local = (ShHandle)0x0;
    }
    else {
      handle_local = (ShHandle)(**(code **)(*plVar1 + 0x68))();
    }
  }
  return handle_local;
}

Assistant:

const void* ShGetExecutable(const ShHandle handle)
{
    if (handle == nullptr)
        return nullptr;

    TShHandleBase* base = reinterpret_cast<TShHandleBase*>(handle);

    TLinker* linker = static_cast<TLinker*>(base->getAsLinker());
    if (linker == nullptr)
        return nullptr;

    return linker->getObjectCode();
}